

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall xmrig::Client::parseResponse(Client *this,int64_t id,Value *result,Value *error)

{
  char *pcVar1;
  IClientListener *pIVar2;
  bool bVar3;
  Type pGVar4;
  Type pGVar5;
  int iVar6;
  Value *pVVar7;
  Client *this_00;
  int code;
  uint local_24;
  
  bVar3 = BaseClient::handleResponse(&this->super_BaseClient,id,result,error);
  if (!bVar3) {
    if ((error->data_).f.flags == 3) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)error,"message");
      pGVar5 = (Type)((ulong)(pGVar4->data_).s.str & 0xffffffffffff);
      if (((pGVar4->data_).f.flags >> 0xc & 1) != 0) {
        pGVar5 = pGVar4;
      }
      this_00 = this;
      bVar3 = BaseClient::handleSubmitResponse(&this->super_BaseClient,id,(char *)pGVar5);
      iVar6 = (int)id;
      if (((!bVar3) && ((this->super_BaseClient).m_quiet == false)) &&
         ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
        pcVar1 = (this->super_BaseClient).m_pool.m_url.m_url.m_data;
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)error,"code");
        iVar6 = 0x1896e5;
        this_00 = (Client *)0x3;
        Log::print(ERR,"[%s] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",pcVar1,pGVar5,
                   (ulong)(pGVar4->data_).s.length);
      }
      if ((this->super_BaseClient).m_id != 1) {
        bVar3 = isCriticalError(this_00,(char *)pGVar5);
        iVar6 = (int)pGVar5;
        if (!bVar3) {
          return;
        }
      }
      close(this,iVar6);
      return;
    }
    if ((result->data_).f.flags == 3) {
      if (id != 1) {
        BaseClient::handleSubmitResponse(&this->super_BaseClient,id,(char *)0x0);
        return;
      }
      local_24 = 0xffffffff;
      pVVar7 = result;
      bVar3 = parseLogin(this,result,(int *)&local_24);
      iVar6 = (int)pVVar7;
      if (bVar3) {
        (this->super_BaseClient).m_failures = 0;
        pIVar2 = (this->super_BaseClient).m_listener;
        (*pIVar2->_vptr_IClientListener[5])(pIVar2,this);
        pIVar2 = (this->super_BaseClient).m_listener;
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)result,"job");
        (*pIVar2->_vptr_IClientListener[3])(pIVar2,this,&(this->super_BaseClient).m_job,pGVar5);
      }
      else {
        if (((this->super_BaseClient).m_quiet == false) &&
           ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
          iVar6 = 0x189712;
          Log::print(ERR,"[%s] login error code: %d",
                     (this->super_BaseClient).m_pool.m_url.m_url.m_data,(ulong)local_24);
        }
        close(this,iVar6);
      }
    }
  }
  return;
}

Assistant:

void xmrig::Client::parseResponse(int64_t id, const rapidjson::Value &result, const rapidjson::Value &error)
{
    if (handleResponse(id, result, error)) {
        return;
    }

    if (error.IsObject()) {
        const char *message = error["message"].GetString();

        if (!handleSubmitResponse(id, message) && !isQuiet()) {
            LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", url(), message, error["code"].GetInt());
        }

        if (m_id == 1 || isCriticalError(message)) {
            close();
        }

        return;
    }

    if (!result.IsObject()) {
        return;
    }

    if (id == 1) {
        int code = -1;
        if (!parseLogin(result, &code)) {
            if (!isQuiet()) {
                LOG_ERR("[%s] login error code: %d", url(), code);
            }

            close();
            return;
        }

        m_failures = 0;
        m_listener->onLoginSuccess(this);
        m_listener->onJobReceived(this, m_job, result["job"]);
        return;
    }

    handleSubmitResponse(id);
}